

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::jmespath::
eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
create_json<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
          (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *args)

{
  pointer pbVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *ptr;
  __single_object temp;
  value_type *in_stack_ffffffffffffffb8;
  vector<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  *this_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  vector<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  local_18;
  
  this_00 = &local_18;
  std::
  make_unique<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
            (in_stack_ffffffffffffffd8);
  pbVar1 = std::
           unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
           ::get((unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                  *)this_00);
  std::
  vector<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  ::push_back(this_00,in_stack_ffffffffffffffb8);
  std::
  unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                 *)this_00);
  return pbVar1;
}

Assistant:

Json* create_json(Args&& ... args)
        {
            auto temp = jsoncons::make_unique<Json>(std::forward<Args>(args)...);
            Json* ptr = temp.get();
            temp_storage_.push_back(std::move(temp));
            return ptr;
        }